

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

uint64_t read_uleb128(dwarf_buf *buf)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  
  uVar5 = 0;
  uVar6 = 0;
  bVar3 = false;
  do {
    pbVar2 = buf->buf;
    iVar4 = advance(buf,1);
    if (iVar4 == 0) {
      return 0;
    }
    bVar1 = *pbVar2;
    if (uVar6 < 0x40) {
      uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)uVar6 & 0x3f);
    }
    else {
      if (!bVar3) {
        dwarf_buf_error(buf,"LEB128 overflows uint64_t",0);
      }
      bVar3 = true;
    }
    uVar6 = uVar6 + 7;
  } while ((char)bVar1 < '\0');
  return uVar5;
}

Assistant:

static uint64_t
read_uleb128 (struct dwarf_buf *buf)
{
  uint64_t ret;
  unsigned int shift;
  int overflow;
  unsigned char b;

  ret = 0;
  shift = 0;
  overflow = 0;
  do
    {
      const unsigned char *p;

      p = buf->buf;
      if (!advance (buf, 1))
	return 0;
      b = *p;
      if (shift < 64)
	ret |= ((uint64_t) (b & 0x7f)) << shift;
      else if (!overflow)
	{
	  dwarf_buf_error (buf, "LEB128 overflows uint64_t", 0);
	  overflow = 1;
	}
      shift += 7;
    }
  while ((b & 0x80) != 0);

  return ret;
}